

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void wallet::FlushAndDeleteWallet(CWallet *wallet)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar4;
  UniqueLock<GlobalMutex> criticalblock12;
  string name;
  mutex_type *in_stack_ffffffffffffff88;
  bool in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  long *plVar5;
  undefined8 in_stack_ffffffffffffffa0;
  long local_58 [2];
  key_type local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (wallet->m_name)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (wallet->m_name)._M_string_length);
  plVar5 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff98,local_48._M_dataplus._M_p,
             local_48._M_dataplus._M_p + local_48._M_string_length);
  parameters._M_string_length._0_1_ = in_stack_ffffffffffffff90;
  parameters._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff88;
  parameters._M_string_length._1_7_ = in_stack_ffffffffffffff91;
  parameters.field_2._M_allocated_capacity = (size_type)plVar5;
  parameters.field_2._8_8_ = in_stack_ffffffffffffffa0;
  CWallet::WalletLogPrintf<std::__cxx11::string>(wallet,"Releasing wallet %s..\n",parameters);
  if (plVar5 != local_58) {
    operator_delete(plVar5,local_58[0] + 1);
  }
  CWallet::Flush(wallet);
  CWallet::~CWallet(wallet);
  operator_delete(wallet,0x4a8);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&stack0xffffffffffffff88);
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)g_unloading_wallet_set_abi_cxx11_,&local_48);
  uVar2 = g_unloading_wallet_set_abi_cxx11_._40_8_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)g_unloading_wallet_set_abi_cxx11_,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  uVar3 = g_unloading_wallet_set_abi_cxx11_._40_8_;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&stack0xffffffffffffff88);
  if (uVar2 != uVar3) {
    std::condition_variable::notify_all();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void FlushAndDeleteWallet(CWallet* wallet)
{
    const std::string name = wallet->GetName();
    wallet->WalletLogPrintf("Releasing wallet %s..\n", name);
    wallet->Flush();
    delete wallet;
    // Wallet is now released, notify WaitForDeleteWallet, if any.
    {
        LOCK(g_wallet_release_mutex);
        if (g_unloading_wallet_set.erase(name) == 0) {
            // WaitForDeleteWallet was not called for this wallet, all done.
            return;
        }
    }
    g_wallet_release_cv.notify_all();
}